

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O2

FT_Error FT_Stream_ReadFields(FT_Stream stream,FT_Frame_Field *fields,void *structure)

{
  byte bVar1;
  FT_Byte FVar2;
  bool bVar3;
  FT_Error FVar4;
  ulong uVar5;
  sbyte sVar6;
  ushort uVar7;
  uint uVar8;
  ulong uVar9;
  uint *__src;
  FT_UShort *pFVar10;
  uint *puVar11;
  
  if (fields == (FT_Frame_Field *)0x0) {
    FVar4 = 6;
  }
  else {
    if (stream != (FT_Stream)0x0) {
      __src = (uint *)stream->cursor;
      pFVar10 = &fields->offset;
      bVar3 = false;
      do {
        sVar6 = 0x10;
        bVar1 = ((FT_Frame_Field *)(pFVar10 + -1))->value;
        switch(bVar1) {
        case 4:
          FVar4 = FT_Stream_EnterFrame(stream,(ulong)*pFVar10);
          if (FVar4 != 0) goto LAB_001ef59b;
          bVar3 = true;
          puVar11 = (uint *)stream->cursor;
          break;
        default:
          stream->cursor = (uchar *)__src;
          FVar4 = 0;
LAB_001ef59b:
          if (!bVar3) {
            return FVar4;
          }
          FT_Stream_ExitFrame(stream);
          return FVar4;
        case 8:
        case 9:
          uVar9 = (ulong)(byte)*__src;
          puVar11 = (uint *)((long)__src + 1);
          sVar6 = 0x18;
          goto LAB_001ef50f;
        case 0xc:
        case 0xd:
          uVar7 = (ushort)*__src << 8 | (ushort)*__src >> 8;
          goto LAB_001ef4ea;
        case 0xe:
        case 0xf:
          uVar7 = (ushort)*__src;
LAB_001ef4ea:
          uVar9 = (ulong)uVar7;
          puVar11 = (uint *)((long)__src + 2);
LAB_001ef50f:
          uVar5 = (long)(((int)uVar9 << sVar6) >> sVar6);
          if ((bVar1 & 1) == 0) {
            uVar5 = uVar9;
          }
          uVar9 = (ulong)*pFVar10;
          FVar2 = *(FT_Byte *)((long)pFVar10 + -1);
          if (FVar2 == '\x04') {
            *(int *)((long)structure + uVar9) = (int)uVar5;
          }
          else if (FVar2 == '\x02') {
            *(short *)((long)structure + uVar9) = (short)uVar5;
          }
          else if (FVar2 == '\x01') {
            *(char *)((long)structure + uVar9) = (char)uVar5;
          }
          else {
            *(ulong *)((long)structure + uVar9) = uVar5;
          }
          break;
        case 0x10:
        case 0x11:
          uVar8 = *__src;
          uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
          goto LAB_001ef496;
        case 0x12:
        case 0x13:
          uVar8 = *__src;
LAB_001ef496:
          uVar9 = (ulong)uVar8;
          puVar11 = __src + 1;
          sVar6 = 0;
          goto LAB_001ef50f;
        case 0x14:
        case 0x15:
          uVar9 = (ulong)*(byte *)((long)__src + 2) |
                  (ulong)((uint)*(byte *)((long)__src + 1) << 8 | (uint)(byte)*__src << 0x10);
          goto LAB_001ef50c;
        case 0x16:
        case 0x17:
          uVar9 = (ulong)(uint3)*__src;
LAB_001ef50c:
          puVar11 = (uint *)((long)__src + 3);
          sVar6 = 8;
          goto LAB_001ef50f;
        case 0x18:
        case 0x19:
          puVar11 = (uint *)((long)__src + (ulong)*(FT_Byte *)((long)pFVar10 + -1));
          if (stream->limit < puVar11) {
            FVar4 = 0x55;
            goto LAB_001ef59b;
          }
          if (bVar1 == 0x18) {
            memcpy((void *)((ulong)*pFVar10 + (long)structure),__src,
                   (ulong)*(FT_Byte *)((long)pFVar10 + -1));
          }
        }
        __src = puVar11;
        pFVar10 = pFVar10 + 2;
      } while( true );
    }
    FVar4 = 0x28;
  }
  return FVar4;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Stream_ReadFields( FT_Stream              stream,
                        const FT_Frame_Field*  fields,
                        void*                  structure )
  {
    FT_Error  error;
    FT_Bool   frame_accessed = 0;
    FT_Byte*  cursor;


    if ( !fields )
      return FT_THROW( Invalid_Argument );

    if ( !stream )
      return FT_THROW( Invalid_Stream_Handle );

    cursor = stream->cursor;

    error = FT_Err_Ok;
    do
    {
      FT_ULong  value;
      FT_Int    sign_shift;
      FT_Byte*  p;


      switch ( fields->value )
      {
      case ft_frame_start:  /* access a new frame */
        error = FT_Stream_EnterFrame( stream, fields->offset );
        if ( error )
          goto Exit;

        frame_accessed = 1;
        cursor         = stream->cursor;
        fields++;
        continue;  /* loop! */

      case ft_frame_bytes:  /* read a byte sequence */
      case ft_frame_skip:   /* skip some bytes      */
        {
          FT_UInt  len = fields->size;


          if ( cursor + len > stream->limit )
          {
            error = FT_THROW( Invalid_Stream_Operation );
            goto Exit;
          }

          if ( fields->value == ft_frame_bytes )
          {
            p = (FT_Byte*)structure + fields->offset;
            FT_MEM_COPY( p, cursor, len );
          }
          cursor += len;
          fields++;
          continue;
        }

      case ft_frame_byte:
      case ft_frame_schar:  /* read a single byte */
        value = FT_NEXT_BYTE( cursor );
        sign_shift = 24;
        break;

      case ft_frame_short_be:
      case ft_frame_ushort_be:  /* read a 2-byte big-endian short */
        value = FT_NEXT_USHORT( cursor );
        sign_shift = 16;
        break;

      case ft_frame_short_le:
      case ft_frame_ushort_le:  /* read a 2-byte little-endian short */
        value = FT_NEXT_USHORT_LE( cursor );
        sign_shift = 16;
        break;

      case ft_frame_long_be:
      case ft_frame_ulong_be:  /* read a 4-byte big-endian long */
        value = FT_NEXT_ULONG( cursor );
        sign_shift = 0;
        break;

      case ft_frame_long_le:
      case ft_frame_ulong_le:  /* read a 4-byte little-endian long */
        value = FT_NEXT_ULONG_LE( cursor );
        sign_shift = 0;
        break;

      case ft_frame_off3_be:
      case ft_frame_uoff3_be:  /* read a 3-byte big-endian long */
        value = FT_NEXT_UOFF3( cursor );
        sign_shift = 8;
        break;

      case ft_frame_off3_le:
      case ft_frame_uoff3_le:  /* read a 3-byte little-endian long */
        value = FT_NEXT_UOFF3_LE( cursor );
        sign_shift = 8;
        break;

      default:
        /* otherwise, exit the loop */
        stream->cursor = cursor;
        goto Exit;
      }

      /* now, compute the signed value is necessary */
      if ( fields->value & FT_FRAME_OP_SIGNED )
        value = (FT_ULong)( (FT_Int32)( value << sign_shift ) >> sign_shift );

      /* finally, store the value in the object */

      p = (FT_Byte*)structure + fields->offset;
      switch ( fields->size )
      {
      case ( 8 / FT_CHAR_BIT ):
        *(FT_Byte*)p = (FT_Byte)value;
        break;

      case ( 16 / FT_CHAR_BIT ):
        *(FT_UShort*)p = (FT_UShort)value;
        break;

      case ( 32 / FT_CHAR_BIT ):
        *(FT_UInt32*)p = (FT_UInt32)value;
        break;

      default:  /* for 64-bit systems */
        *(FT_ULong*)p = (FT_ULong)value;
      }

      /* go to next field */
      fields++;
    }
    while ( 1 );

  Exit:
    /* close the frame if it was opened by this read */
    if ( frame_accessed )
      FT_Stream_ExitFrame( stream );

    return error;
  }